

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

Message __thiscall Server::Receive(Server *this)

{
  Message MVar1;
  ssize_t sVar2;
  Server *this_local;
  Message msg;
  
  Message::Message((Message *)&this_local);
  sVar2 = recv(this->newsockfd,&this_local,0x10,0);
  this->n = (int)sVar2;
  if (this->n < 0) {
    printf("ERROR in Server reading from Client\'s socket!\n");
  }
  else {
    (this->msg_from_client).scalar1 = (long)this_local;
    (this->msg_from_client).scalar2 = msg.scalar1;
  }
  MVar1.scalar2 = msg.scalar1;
  MVar1.scalar1 = (long)this_local;
  return MVar1;
}

Assistant:

const Message Server::Receive()
{
    Message msg;
    n = recv(newsockfd, &msg, sizeof(msg), 0);
    
    if (n < 0)
        printf("ERROR in Server reading from Client's socket!\n");
    else
        msg_from_client = msg;

    return msg;
}